

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_iterate(void)

{
  _Bool _Var1;
  int iVar2;
  bitset_t *bitset;
  size_t sVar3;
  size_t local_38;
  
  bitset = bitset_create();
  for (sVar3 = 0; sVar3 != 3000; sVar3 = sVar3 + 3) {
    bitset_set(bitset,sVar3);
  }
  sVar3 = bitset_count(bitset);
  _assert_true((ulong)(sVar3 == 1000),"bitset_count(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x14);
  iVar2 = compute_cardinality(bitset);
  _assert_true((ulong)(iVar2 == 1000),"compute_cardinality(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x15);
  local_38 = 0;
  sVar3 = 0;
  while( true ) {
    _Var1 = bitset_next_set_bit(bitset,&local_38);
    if (!_Var1) break;
    _assert_true((ulong)(sVar3 == local_38),"i == k",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                 ,0x18);
    sVar3 = sVar3 + 3;
    local_38 = local_38 + 1;
  }
  _assert_true((ulong)(sVar3 == 3000),"k == 3000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x1b);
  bitset_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(test_iterate) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(bitset_count(b) == 1000);
    assert_true(compute_cardinality(b) == 1000);
    size_t k = 0;
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        assert_true(i == k);
        k += 3;
    }
    assert_true(k == 3000);
    bitset_free(b);
}